

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O0

void baryonyx::notice<double,double,double,double,double,double>
               (context *ctx,char *fmt,double *arg1,double *args,double *args_1,double *args_2,
               double *args_3,double *args_4)

{
  bool bVar1;
  double *args_local_2;
  double *args_local_1;
  double *args_local;
  double *arg1_local;
  char *fmt_local;
  context *ctx_local;
  
  bVar1 = is_loggable(ctx->log_priority,5);
  if (bVar1) {
    log<double,double,double,double,double,double>
              (_stdout,5,fmt,arg1,args,args_1,args_2,args_3,args_4);
  }
  return;
}

Assistant:

void
notice(const context& ctx,
       const char* fmt,
       const Arg1& arg1,
       const Args&... args)
{
#ifdef BARYONYX_ENABLE_LOG
    if (!is_loggable(ctx.log_priority, 5))
        return;

    log(stdout, 5, fmt, arg1, args...);
#else
    detail::sink(ctx, fmt, arg1, args...);
#endif
}